

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::dump
          (Element_variable *this,ostream *os,Dump_state *state)

{
  Expression_node::Dump_state::write_indent(state,os);
  std::operator<<(os,(string *)&this->matrix_variable->name);
  write_indexes(this,os);
  std::operator<<(os,"\n");
  return;
}

Assistant:

virtual void dump(std::ostream &os, Dump_state &state) const override
    {
        state.write_indent(os);
        os << matrix_variable->name;
        write_indexes(os);
        os << "\n";
    }